

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

void __thiscall Centaurus::NFA<wchar_t>::NFA(NFA<wchar_t> *this)

{
  CharClass<wchar_t> local_48;
  
  (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
  super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001a78a0;
  std::
  vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ::_M_realloc_insert<>
            (&(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states,(iterator)0x0);
  local_48._vptr_CharClass = (_func_int **)&PTR__CharClass_001a64f8;
  local_48.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  add_state(this,&local_48);
  local_48._vptr_CharClass = (_func_int **)&PTR__CharClass_001a64f8;
  std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::~vector
            (&local_48.m_ranges);
  return;
}

Assistant:

NFA()
    {
        m_states.emplace_back();
        add_state(CharClass<TCHAR>());
    }